

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doomtype.h
# Opt level: O2

int __thiscall FListMenuItemPatch::GetWidth(FListMenuItemPatch *this)

{
  int iVar1;
  long lVar2;
  
  lVar2 = (long)*(int *)&(this->super_FListMenuItemSelectable).field_0x24;
  if (0 < lVar2) {
    iVar1 = FTexture::GetScaledWidth(TexMan.Textures.Array[lVar2].Texture);
    return iVar1;
  }
  return 0;
}

Assistant:

bool isValid() const { return texnum > 0; }